

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctr_drbg.c
# Opt level: O0

int mbedtls_ctr_drbg_write_seed_file(mbedtls_ctr_drbg_context *ctx,char *path)

{
  FILE *__s;
  size_t sVar1;
  uchar local_138 [8];
  uchar buf [256];
  FILE *f;
  int ret;
  char *path_local;
  mbedtls_ctr_drbg_context *ctx_local;
  
  __s = fopen(path,"wb");
  if (__s == (FILE *)0x0) {
    ctx_local._4_4_ = -0x3a;
  }
  else {
    f._4_4_ = mbedtls_ctr_drbg_random(ctx,local_138,0x100);
    if (f._4_4_ == 0) {
      sVar1 = fwrite(local_138,1,0x100,__s);
      if (sVar1 == 0x100) {
        f._4_4_ = 0;
      }
      else {
        f._4_4_ = -0x3a;
      }
    }
    mbedtls_platform_zeroize(local_138,0x100);
    fclose(__s);
    ctx_local._4_4_ = f._4_4_;
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_ctr_drbg_write_seed_file( mbedtls_ctr_drbg_context *ctx,
                                      const char *path )
{
    int ret = MBEDTLS_ERR_CTR_DRBG_FILE_IO_ERROR;
    FILE *f;
    unsigned char buf[ MBEDTLS_CTR_DRBG_MAX_INPUT ];

    if( ( f = fopen( path, "wb" ) ) == NULL )
        return( MBEDTLS_ERR_CTR_DRBG_FILE_IO_ERROR );

    if( ( ret = mbedtls_ctr_drbg_random( ctx, buf,
                                         MBEDTLS_CTR_DRBG_MAX_INPUT ) ) != 0 )
        goto exit;

    if( fwrite( buf, 1, MBEDTLS_CTR_DRBG_MAX_INPUT, f ) !=
        MBEDTLS_CTR_DRBG_MAX_INPUT )
    {
        ret = MBEDTLS_ERR_CTR_DRBG_FILE_IO_ERROR;
    }
    else
    {
        ret = 0;
    }

exit:
    mbedtls_platform_zeroize( buf, sizeof( buf ) );

    fclose( f );
    return( ret );
}